

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remote_cid.c
# Opt level: O3

void promote_cid(quicly_remote_cid_set_t *set,size_t idx_to_promote)

{
  quicly_remote_cid_t *pqVar1;
  st_quicly_cid_t *psVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  int iVar8;
  undefined4 uVar9;
  
  if (idx_to_promote == 0) {
    __assert_fail("idx_to_promote > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/remote_cid.c"
                  ,0x39,"void promote_cid(quicly_remote_cid_set_t *, size_t)");
  }
  if (set->cids[0].is_active == 0) {
    uVar3 = set->cids[0].sequence;
    *(undefined8 *)(set->cids[0].stateless_reset_token + 0xb) =
         *(undefined8 *)(set->cids[idx_to_promote].stateless_reset_token + 0xb);
    pqVar1 = set->cids + idx_to_promote;
    iVar8 = pqVar1->is_active;
    uVar9 = *(undefined4 *)&pqVar1->field_0x4;
    uVar4 = pqVar1->sequence;
    psVar2 = &set->cids[idx_to_promote].cid;
    uVar5 = *(undefined8 *)psVar2->cid;
    uVar6 = *(undefined8 *)(psVar2->cid + 8);
    psVar2 = &set->cids[idx_to_promote].cid;
    uVar7 = *(undefined8 *)((long)(psVar2 + 1) + 3);
    *(undefined8 *)(set->cids[0].cid.cid + 0x10) = *(undefined8 *)(psVar2->cid + 0x10);
    *(undefined8 *)(set->cids[0].stateless_reset_token + 3) = uVar7;
    *(undefined8 *)set->cids[0].cid.cid = uVar5;
    *(undefined8 *)(set->cids[0].cid.cid + 8) = uVar6;
    set->cids[0].is_active = iVar8;
    *(undefined4 *)&set->cids[0].field_0x4 = uVar9;
    set->cids[0].sequence = uVar4;
    set->cids[idx_to_promote].is_active = 0;
    set->cids[idx_to_promote].sequence = uVar3;
    return;
  }
  __assert_fail("!set->cids[0].is_active",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/remote_cid.c"
                ,0x3a,"void promote_cid(quicly_remote_cid_set_t *, size_t)");
}

Assistant:

static void promote_cid(quicly_remote_cid_set_t *set, size_t idx_to_promote)
{
    uint64_t seq_tmp = set->cids[0].sequence;

    assert(idx_to_promote > 0);
    assert(!set->cids[0].is_active);

    set->cids[0] = set->cids[idx_to_promote];
    set->cids[idx_to_promote].is_active = 0;
    set->cids[idx_to_promote].sequence = seq_tmp;
}